

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSweeper.c
# Opt level: O1

Vec_Int_t * Gia_SweeperCollectValidProbeIds(Gia_Man_t *p)

{
  void *pvVar1;
  Vec_Int_t *p_00;
  int *piVar2;
  long lVar3;
  long lVar4;
  
  pvVar1 = p->pData;
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 1000;
  p_00->nSize = 0;
  piVar2 = (int *)malloc(4000);
  p_00->pArray = piVar2;
  lVar3 = *(long *)((long)pvVar1 + 0x10);
  if (0 < *(int *)(lVar3 + 4)) {
    lVar4 = 0;
    do {
      if (-1 < *(int *)(*(long *)(lVar3 + 8) + lVar4 * 4)) {
        Vec_IntPush(p_00,(int)lVar4);
      }
      lVar4 = lVar4 + 1;
      lVar3 = *(long *)((long)pvVar1 + 0x10);
    } while (lVar4 < *(int *)(lVar3 + 4));
  }
  return p_00;
}

Assistant:

Vec_Int_t * Gia_SweeperCollectValidProbeIds( Gia_Man_t * p )
{
    Swp_Man_t * pSwp = (Swp_Man_t *)p->pData;
    Vec_Int_t * vProbeIds = Vec_IntAlloc( 1000 );
    int iLit, ProbeId;
    Vec_IntForEachEntry( pSwp->vProbes, iLit, ProbeId )
    {
        if ( iLit < 0 ) continue;
        Vec_IntPush( vProbeIds, ProbeId );
    }
    return vProbeIds;
}